

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * __thiscall
soul::Value::toExternalValue(soul::ConstantTable_const&,soul::StringDictionary_const&)::
Value_const__(Value *__return_storage_ptr__,void *this,Value *source)

{
  long *plVar1;
  ConstantTable *this_00;
  pointer pcVar2;
  size_type sVar3;
  pointer puVar4;
  double dVar5;
  Category CVar6;
  bool bVar7;
  Handle HVar8;
  Handle handle;
  Value *source_00;
  ArraySize AVar9;
  Structure *pSVar10;
  int64_t iVar11;
  uint32_t numElements;
  size_t sVar12;
  long lVar13;
  float fVar14;
  string_view sVar15;
  string_view name;
  Value *v;
  Type elementType;
  undefined1 local_190 [24];
  StringDictionary local_178;
  void *local_128;
  Member *local_120;
  size_t local_118;
  Value local_110;
  undefined1 local_d0 [16];
  RefCountedPtr<soul::Structure> local_c0 [5];
  Value local_98;
  
  CVar6 = (source->type).category;
  if (CVar6 == stringLiteral) {
    plVar1 = *(long **)((long)this + 8);
    HVar8 = getStringLiteral(source);
    sVar15 = (string_view)(**(code **)(*plVar1 + 0x18))(plVar1,HVar8.handle);
    choc::value::Value::Value(__return_storage_ptr__,sVar15);
    return __return_storage_ptr__;
  }
  if (CVar6 == vector) {
    AVar9 = Type::getVectorSize(&source->type);
    Type::getElementType((Type *)local_d0,&source->type);
    numElements = (uint32_t)AVar9;
    switch(local_d0._4_4_) {
    case 2:
      choc::value::Type::createVector<float>((Type *)local_190,numElements);
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_190);
      choc::value::Type::deleteAllocatedObjects((Type *)local_190);
      puVar4 = (__return_storage_ptr__->packedData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar12 = 0; (AVar9 & 0xffffffff) != sVar12; sVar12 = sVar12 + 1) {
        SubElementPath::SubElementPath((SubElementPath *)&local_110,sVar12);
        getSubElement((Value *)local_190,source,(SubElementPath *)&local_110);
        fVar14 = getAsFloat((Value *)local_190);
        ~Value((Value *)local_190);
        ArrayWithPreallocation<unsigned_long,_4UL>::clear
                  ((ArrayWithPreallocation<unsigned_long,_4UL> *)&local_110);
        *(float *)(puVar4 + sVar12 * 4) = fVar14;
      }
      break;
    case 3:
      choc::value::Type::createVector<double>((Type *)local_190,numElements);
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_190);
      choc::value::Type::deleteAllocatedObjects((Type *)local_190);
      puVar4 = (__return_storage_ptr__->packedData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar12 = 0; (AVar9 & 0xffffffff) != sVar12; sVar12 = sVar12 + 1) {
        SubElementPath::SubElementPath((SubElementPath *)&local_110,sVar12);
        getSubElement((Value *)local_190,source,(SubElementPath *)&local_110);
        dVar5 = getAsDouble((Value *)local_190);
        ~Value((Value *)local_190);
        ArrayWithPreallocation<unsigned_long,_4UL>::clear
                  ((ArrayWithPreallocation<unsigned_long,_4UL> *)&local_110);
        *(double *)(puVar4 + sVar12 * 8) = dVar5;
      }
      break;
    default:
      RefCountedPtr<soul::Structure>::~RefCountedPtr(local_c0);
      CVar6 = (source->type).category;
      goto switchD_001e2bb3_caseD_4;
    case 7:
      choc::value::Type::createVector<int>((Type *)local_190,numElements);
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_190);
      choc::value::Type::deleteAllocatedObjects((Type *)local_190);
      puVar4 = (__return_storage_ptr__->packedData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar12 = 0; (AVar9 & 0xffffffff) != sVar12; sVar12 = sVar12 + 1) {
        SubElementPath::SubElementPath((SubElementPath *)&local_110,sVar12);
        getSubElement((Value *)local_190,source,(SubElementPath *)&local_110);
        iVar11 = getAsInt64((Value *)local_190);
        ~Value((Value *)local_190);
        ArrayWithPreallocation<unsigned_long,_4UL>::clear
                  ((ArrayWithPreallocation<unsigned_long,_4UL> *)&local_110);
        *(int *)(puVar4 + sVar12 * 4) = (int)iVar11;
      }
      break;
    case 8:
      choc::value::Type::createVector<long>((Type *)local_190,numElements);
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_190);
      choc::value::Type::deleteAllocatedObjects((Type *)local_190);
      puVar4 = (__return_storage_ptr__->packedData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar12 = 0; (AVar9 & 0xffffffff) != sVar12; sVar12 = sVar12 + 1) {
        SubElementPath::SubElementPath((SubElementPath *)&local_110,sVar12);
        getSubElement((Value *)local_190,source,(SubElementPath *)&local_110);
        iVar11 = getAsInt64((Value *)local_190);
        ~Value((Value *)local_190);
        ArrayWithPreallocation<unsigned_long,_4UL>::clear
                  ((ArrayWithPreallocation<unsigned_long,_4UL> *)&local_110);
        *(int64_t *)(puVar4 + sVar12 * 8) = iVar11;
      }
      break;
    case 9:
      choc::value::Type::createVector<bool>((Type *)local_190,numElements);
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_190);
      choc::value::Type::deleteAllocatedObjects((Type *)local_190);
      puVar4 = (__return_storage_ptr__->packedData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar12 = 0; (AVar9 & 0xffffffff) != sVar12; sVar12 = sVar12 + 1) {
        SubElementPath::SubElementPath((SubElementPath *)&local_110,sVar12);
        getSubElement((Value *)local_190,source,(SubElementPath *)&local_110);
        bVar7 = getAsBool((Value *)local_190);
        ~Value((Value *)local_190);
        ArrayWithPreallocation<unsigned_long,_4UL>::clear
                  ((ArrayWithPreallocation<unsigned_long,_4UL> *)&local_110);
        puVar4[sVar12] = bVar7;
      }
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr(local_c0);
    return __return_storage_ptr__;
  }
  if (CVar6 == primitive) {
    CVar6 = primitive;
    switch((source->type).primitiveType.type) {
    case float32:
      fVar14 = getAsFloat(source);
      choc::value::Value::Value(__return_storage_ptr__,fVar14);
      break;
    case float64:
      dVar5 = getAsDouble(source);
      choc::value::Value::Value(__return_storage_ptr__,dVar5);
      break;
    default:
      goto switchD_001e2bb3_caseD_4;
    case int32:
      iVar11 = getAsInt64(source);
      choc::value::Value::Value(__return_storage_ptr__,(int32_t)iVar11);
      break;
    case int64:
      iVar11 = getAsInt64(source);
      choc::value::Value::Value(__return_storage_ptr__,iVar11);
      break;
    case bool_:
      bVar7 = getAsBool(source);
      choc::value::Value::Value(__return_storage_ptr__,bVar7);
    }
  }
  else {
switchD_001e2bb3_caseD_4:
    if ((CVar6 == array) && ((source->type).boundingSize == 0)) {
      this_00 = *this;
      handle = getUnsizedArrayContent(source);
      source_00 = ConstantTable::getValueForHandle(this_00,handle);
      if (source_00 == (Value *)0x0) {
        throwInternalCompilerError("target != nullptr","convert",0x379);
      }
      Value_const__(__return_storage_ptr__,this,source_00);
    }
    else if (CVar6 == array) {
      AVar9 = Type::getArraySize(&source->type);
      local_190[0] = 0x40;
      local_190._8_8_ = (Object *)0x0;
      local_190._16_8_ = 0;
      local_178._vptr_StringDictionary = (_func_int **)0x0;
      choc::value::Value::Value(__return_storage_ptr__,(Type *)local_190);
      choc::value::Type::deleteAllocatedObjects((Type *)local_190);
      for (sVar12 = 0; (AVar9 & 0xffffffff) != sVar12; sVar12 = sVar12 + 1) {
        SubElementPath::SubElementPath((SubElementPath *)local_d0,sVar12);
        getSubElement(&local_110,source,(SubElementPath *)local_d0);
        Value_const__((Value *)local_190,this,&local_110);
        ~Value(&local_110);
        ArrayWithPreallocation<unsigned_long,_4UL>::clear
                  ((ArrayWithPreallocation<unsigned_long,_4UL> *)local_d0);
        choc::value::Value::addArrayElement<choc::value::Value>
                  (__return_storage_ptr__,(Value *)local_190);
        choc::value::Value::~Value((Value *)local_190);
      }
    }
    else {
      local_128 = this;
      if (CVar6 != structure) {
        throwInternalCompilerError("convert",0x38d);
      }
      pSVar10 = Type::getStructRef(&source->type);
      sVar15._M_str = (pSVar10->name)._M_dataplus._M_p;
      sVar15._M_len = (pSVar10->name)._M_string_length;
      choc::value::createObject(__return_storage_ptr__,sVar15);
      local_120 = (pSVar10->members).items;
      local_118 = 0;
      for (lVar13 = (pSVar10->members).numActive << 6; lVar13 != 0; lVar13 = lVar13 + -0x40) {
        pcVar2 = (local_120->name)._M_dataplus._M_p;
        sVar3 = (local_120->name)._M_string_length;
        SubElementPath::SubElementPath((SubElementPath *)&local_110,local_118);
        getSubElement((Value *)local_190,source,(SubElementPath *)&local_110);
        Value_const__(&local_98,local_128,(Value *)local_190);
        name._M_str = pcVar2;
        name._M_len = sVar3;
        choc::value::Value::addMember<choc::value::Value>(__return_storage_ptr__,name,&local_98);
        choc::value::Value::~Value(&local_98);
        ~Value((Value *)local_190);
        ArrayWithPreallocation<unsigned_long,_4UL>::clear
                  ((ArrayWithPreallocation<unsigned_long,_4UL> *)&local_110);
        local_120 = local_120 + 1;
        local_118 = local_118 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value convert (const Value& source)
        {
            const auto& sourceType = source.getType();

            if (sourceType.isPrimitive())
            {
                if (sourceType.isInteger32())   return choc::value::createInt32 (source.getAsInt32());
                if (sourceType.isInteger64())   return choc::value::createInt64 (source.getAsInt64());
                if (sourceType.isFloat32())     return choc::value::createFloat32 (source.getAsFloat());
                if (sourceType.isFloat64())     return choc::value::createFloat64 (source.getAsDouble());
                if (sourceType.isBool())        return choc::value::createBool (source.getAsBool());
            }

            if (sourceType.isStringLiteral())
                return choc::value::createString (dictionary.getStringForHandle (source.getStringLiteral()));

            if (sourceType.isVector())
            {
                auto size = static_cast<uint32_t> (sourceType.getVectorSize());
                auto elementType = sourceType.getElementType();

                if (elementType.isInteger32())   return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsInt32(); });
                if (elementType.isInteger64())   return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsInt64(); });
                if (elementType.isFloat32())     return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsFloat(); });
                if (elementType.isFloat64())     return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsDouble(); });
                if (elementType.isBool())        return choc::value::createVector (size, [&] (uint32_t index)  { return source.getSubElement (index).getAsBool(); });
            }

            if (sourceType.isUnsizedArray())
            {
                auto target = constants.getValueForHandle (source.getUnsizedArrayContent());
                SOUL_ASSERT (target != nullptr);
                return convert (*target);
            }

            if (sourceType.isArray())
                return choc::value::createArray (static_cast<uint32_t> (sourceType.getArraySize()),
                                                 [&] (uint32_t i) { return convert (source.getSubElement (i)); });

            if (sourceType.isStruct())
            {
                auto& s = sourceType.getStructRef();
                auto o = choc::value::createObject (s.getName());
                size_t i = 0;

                for (auto& m : s.getMembers())
                    o.addMember (m.name, convert (source.getSubElement (i++)));

                return o;
            }

            SOUL_ASSERT_FALSE;
            return {};
        }